

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_trace(sqlite3 *db,_func_void_void_ptr_char_ptr *xTrace,void *pArg)

{
  void *pvVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    pvVar1 = db->pTraceArg;
    db->xTrace = xTrace;
    db->pTraceArg = pArg;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    pvVar1 = db->pTraceArg;
    db->xTrace = xTrace;
    db->pTraceArg = pArg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_trace(sqlite3 *db, void (*xTrace)(void*,const char*), void *pArg){
  void *pOld;
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pTraceArg;
  db->xTrace = xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}